

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_postprocess.cpp
# Opt level: O0

void __thiscall FGLRenderer::BloomScene(FGLRenderer *this)

{
  FGLBloomTextureLevel *pFVar1;
  FGLRenderBuffers *pFVar2;
  FGLRenderBuffers *pFVar3;
  bool bVar4;
  int sampleCount_00;
  int iVar5;
  float blurAmount_00;
  FGLBloomTextureLevel *next_1;
  FGLBloomTextureLevel *level_1;
  int i_1;
  FGLBloomTextureLevel *next;
  FGLBloomTextureLevel *level;
  int i;
  FGLBloomTextureLevel *level0;
  int sampleCount;
  float blurAmount;
  FGLPostProcessState savedState;
  FString local_18;
  FGLRenderer *local_10;
  FGLRenderer *this_local;
  
  local_10 = this;
  bVar4 = FBoolCVar::operator_cast_to_bool(&gl_bloom);
  if ((bVar4) && (gl_fixedcolormap == 0)) {
    FString::FString(&local_18,"BloomScene");
    FGLDebug::PushGroup(&local_18);
    FString::~FString(&local_18);
    FGLPostProcessState::FGLPostProcessState((FGLPostProcessState *)&sampleCount);
    blurAmount_00 = FFloatCVar::operator_cast_to_float(&gl_bloom_amount);
    sampleCount_00 = FIntCVar::operator_cast_to_int(&gl_bloom_kernel_size);
    pFVar2 = this->mBuffers;
    (*_ptrc_glBindFramebuffer)(0x8d40,pFVar2->BloomLevels[0].VFramebuffer);
    (*_ptrc_glViewport)(0,0,pFVar2->BloomLevels[0].Width,pFVar2->BloomLevels[0].Height);
    FGLRenderBuffers::BindCurrentTexture(this->mBuffers,0);
    (*_ptrc_glTexParameteri)(0xde1,0x2801,0x2601);
    (*_ptrc_glTexParameteri)(0xde1,0x2800,0x2601);
    FBloomExtractShader::Bind(this->mBloomExtractShader);
    FBufferedUniformSampler::Set(&this->mBloomExtractShader->SceneTexture,0);
    FBufferedUniform1f::Set(&this->mBloomExtractShader->Exposure,this->mCameraExposure);
    FBufferedUniform2f::Set
              (&this->mBloomExtractShader->Scale,
               (float)(this->mSceneViewport).width / (float)(this->mScreenViewport).width,
               (float)(this->mSceneViewport).height / (float)(this->mScreenViewport).height);
    FBufferedUniform2f::Set
              (&this->mBloomExtractShader->Offset,
               (float)(this->mSceneViewport).left / (float)(this->mScreenViewport).width,
               (float)(this->mSceneViewport).top / (float)(this->mScreenViewport).height);
    RenderScreenQuad(this);
    (*_ptrc_glTexParameteri)(0xde1,0x2801,0x2600);
    (*_ptrc_glTexParameteri)(0xde1,0x2800,0x2600);
    for (level._4_4_ = 0; level._4_4_ < 3; level._4_4_ = level._4_4_ + 1) {
      pFVar1 = this->mBuffers->BloomLevels + level._4_4_;
      pFVar3 = this->mBuffers;
      iVar5 = level._4_4_ + 1;
      FBlurShader::BlurHorizontal
                (this->mBlurShader,this,blurAmount_00,sampleCount_00,pFVar1->VTexture,
                 pFVar1->HFramebuffer,pFVar1->Width,pFVar1->Height);
      FBlurShader::BlurVertical
                (this->mBlurShader,this,blurAmount_00,sampleCount_00,pFVar1->HTexture,
                 pFVar3->BloomLevels[iVar5].VFramebuffer,pFVar3->BloomLevels[iVar5].Width,
                 pFVar3->BloomLevels[iVar5].Height);
    }
    for (level_1._4_4_ = 3; 0 < level_1._4_4_; level_1._4_4_ = level_1._4_4_ + -1) {
      pFVar1 = this->mBuffers->BloomLevels + level_1._4_4_;
      pFVar3 = this->mBuffers;
      iVar5 = level_1._4_4_ + -1;
      FBlurShader::BlurHorizontal
                (this->mBlurShader,this,blurAmount_00,sampleCount_00,pFVar1->VTexture,
                 pFVar1->HFramebuffer,pFVar1->Width,pFVar1->Height);
      FBlurShader::BlurVertical
                (this->mBlurShader,this,blurAmount_00,sampleCount_00,pFVar1->HTexture,
                 pFVar1->VFramebuffer,pFVar1->Width,pFVar1->Height);
      (*_ptrc_glBindFramebuffer)(0x8d40,pFVar3->BloomLevels[iVar5].VFramebuffer);
      (*_ptrc_glViewport)(0,0,pFVar3->BloomLevels[iVar5].Width,pFVar3->BloomLevels[iVar5].Height);
      (*_ptrc_glActiveTexture)(0x84c0);
      (*_ptrc_glBindTexture)(0xde1,pFVar1->VTexture);
      (*_ptrc_glTexParameteri)(0xde1,0x2801,0x2601);
      (*_ptrc_glTexParameteri)(0xde1,0x2800,0x2601);
      FBloomCombineShader::Bind(this->mBloomCombineShader);
      FBufferedUniformSampler::Set(&this->mBloomCombineShader->BloomTexture,0);
      RenderScreenQuad(this);
    }
    FBlurShader::BlurHorizontal
              (this->mBlurShader,this,blurAmount_00,sampleCount_00,pFVar2->BloomLevels[0].VTexture,
               pFVar2->BloomLevels[0].HFramebuffer,pFVar2->BloomLevels[0].Width,
               pFVar2->BloomLevels[0].Height);
    FBlurShader::BlurVertical
              (this->mBlurShader,this,blurAmount_00,sampleCount_00,pFVar2->BloomLevels[0].HTexture,
               pFVar2->BloomLevels[0].VFramebuffer,pFVar2->BloomLevels[0].Width,
               pFVar2->BloomLevels[0].Height);
    FGLRenderBuffers::BindCurrentFB(this->mBuffers);
    (*_ptrc_glViewport)((this->mSceneViewport).left,(this->mSceneViewport).top,
                        (this->mSceneViewport).width,(this->mSceneViewport).height);
    (*_ptrc_glEnable)(0xbe2);
    (*_ptrc_glBlendEquation)(0x8006);
    (*_ptrc_glBlendFunc)(1,1);
    (*_ptrc_glActiveTexture)(0x84c0);
    (*_ptrc_glBindTexture)(0xde1,pFVar2->BloomLevels[0].VTexture);
    (*_ptrc_glTexParameteri)(0xde1,0x2801,0x2601);
    (*_ptrc_glTexParameteri)(0xde1,0x2800,0x2601);
    FBloomCombineShader::Bind(this->mBloomCombineShader);
    FBufferedUniformSampler::Set(&this->mBloomCombineShader->BloomTexture,0);
    RenderScreenQuad(this);
    (*_ptrc_glViewport)((this->mScreenViewport).left,(this->mScreenViewport).top,
                        (this->mScreenViewport).width,(this->mScreenViewport).height);
    FGLDebug::PopGroup();
    FGLPostProcessState::~FGLPostProcessState((FGLPostProcessState *)&sampleCount);
  }
  return;
}

Assistant:

void FGLRenderer::BloomScene()
{
	// Only bloom things if enabled and no special fixed light mode is active
	if (!gl_bloom || gl_fixedcolormap != CM_DEFAULT)
		return;

	FGLDebug::PushGroup("BloomScene");

	FGLPostProcessState savedState;

	const float blurAmount = gl_bloom_amount;
	int sampleCount = gl_bloom_kernel_size;

	const auto &level0 = mBuffers->BloomLevels[0];

	// Extract blooming pixels from scene texture:
	glBindFramebuffer(GL_FRAMEBUFFER, level0.VFramebuffer);
	glViewport(0, 0, level0.Width, level0.Height);
	mBuffers->BindCurrentTexture(0);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
	mBloomExtractShader->Bind();
	mBloomExtractShader->SceneTexture.Set(0);
	mBloomExtractShader->Exposure.Set(mCameraExposure);
	mBloomExtractShader->Scale.Set(mSceneViewport.width / (float)mScreenViewport.width, mSceneViewport.height / (float)mScreenViewport.height);
	mBloomExtractShader->Offset.Set(mSceneViewport.left / (float)mScreenViewport.width, mSceneViewport.top / (float)mScreenViewport.height);
	RenderScreenQuad();
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);

	// Blur and downscale:
	for (int i = 0; i < FGLRenderBuffers::NumBloomLevels - 1; i++)
	{
		const auto &level = mBuffers->BloomLevels[i];
		const auto &next = mBuffers->BloomLevels[i + 1];
		mBlurShader->BlurHorizontal(this, blurAmount, sampleCount, level.VTexture, level.HFramebuffer, level.Width, level.Height);
		mBlurShader->BlurVertical(this, blurAmount, sampleCount, level.HTexture, next.VFramebuffer, next.Width, next.Height);
	}

	// Blur and upscale:
	for (int i = FGLRenderBuffers::NumBloomLevels - 1; i > 0; i--)
	{
		const auto &level = mBuffers->BloomLevels[i];
		const auto &next = mBuffers->BloomLevels[i - 1];

		mBlurShader->BlurHorizontal(this, blurAmount, sampleCount, level.VTexture, level.HFramebuffer, level.Width, level.Height);
		mBlurShader->BlurVertical(this, blurAmount, sampleCount, level.HTexture, level.VFramebuffer, level.Width, level.Height);

		// Linear upscale:
		glBindFramebuffer(GL_FRAMEBUFFER, next.VFramebuffer);
		glViewport(0, 0, next.Width, next.Height);
		glActiveTexture(GL_TEXTURE0);
		glBindTexture(GL_TEXTURE_2D, level.VTexture);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
		mBloomCombineShader->Bind();
		mBloomCombineShader->BloomTexture.Set(0);
		RenderScreenQuad();
	}

	mBlurShader->BlurHorizontal(this, blurAmount, sampleCount, level0.VTexture, level0.HFramebuffer, level0.Width, level0.Height);
	mBlurShader->BlurVertical(this, blurAmount, sampleCount, level0.HTexture, level0.VFramebuffer, level0.Width, level0.Height);

	// Add bloom back to scene texture:
	mBuffers->BindCurrentFB();
	glViewport(mSceneViewport.left, mSceneViewport.top, mSceneViewport.width, mSceneViewport.height);
	glEnable(GL_BLEND);
	glBlendEquation(GL_FUNC_ADD);
	glBlendFunc(GL_ONE, GL_ONE);
	glActiveTexture(GL_TEXTURE0);
	glBindTexture(GL_TEXTURE_2D, level0.VTexture);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
	mBloomCombineShader->Bind();
	mBloomCombineShader->BloomTexture.Set(0);
	RenderScreenQuad();
	glViewport(mScreenViewport.left, mScreenViewport.top, mScreenViewport.width, mScreenViewport.height);

	FGLDebug::PopGroup();
}